

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O0

void emit_asm(BuildCtx *ctx)

{
  int iVar1;
  BuildMode BVar2;
  bool bVar3;
  int n_00;
  BuildReloc *pBVar4;
  int n;
  BuildReloc *r;
  int32_t next;
  int32_t ofs;
  int rel;
  int i;
  BuildCtx *ctx_local;
  
  fprintf((FILE *)ctx->fp,"\t.file \"buildvm_%s.dasc\"\n",ctx->dasm_arch);
  fprintf((FILE *)ctx->fp,"\t.text\n");
  emit_asm_align(ctx,4);
  emit_asm_label(ctx,ctx->beginsym,0,0);
  if (ctx->mode != BUILD_machasm) {
    fprintf((FILE *)ctx->fp,".Lbegin:\n");
  }
  next = 0;
  for (ofs = 0; ofs < ctx->nsym; ofs = ofs + 1) {
    r._4_4_ = ctx->sym[ofs].ofs;
    iVar1 = ctx->sym[ofs + 1].ofs;
    emit_asm_label(ctx,ctx->sym[ofs].name,iVar1 - r._4_4_,1);
    while( true ) {
      bVar3 = false;
      if (next < ctx->nreloc) {
        bVar3 = ctx->reloc[next].ofs <= iVar1;
      }
      if (!bVar3) break;
      pBVar4 = ctx->reloc + next;
      n_00 = pBVar4->ofs - r._4_4_;
      if ((pBVar4->type == 0) || ((ctx->mode != BUILD_elfasm && (ctx->mode != BUILD_machasm)))) {
        emit_asm_bytes(ctx,ctx->code + r._4_4_,n_00);
        emit_asm_reloc(ctx,pBVar4->type,ctx->relocsym[pBVar4->sym]);
      }
      else {
        emit_asm_reloc_text(ctx,ctx->code + r._4_4_,n_00,ctx->relocsym[pBVar4->sym]);
      }
      r._4_4_ = n_00 + 4 + r._4_4_;
      next = next + 1;
    }
    emit_asm_bytes(ctx,ctx->code + r._4_4_,iVar1 - r._4_4_);
  }
  fprintf((FILE *)ctx->fp,"\n");
  BVar2 = ctx->mode;
  if (BVar2 == BUILD_elfasm) {
    fprintf((FILE *)ctx->fp,"\t.section .note.GNU-stack,\"\",@progbits\n");
  }
  else if (BVar2 != BUILD_coffasm) {
    if (BVar2 == BUILD_machasm) {
      fprintf((FILE *)ctx->fp,"\t.cstring\n\t.ascii \"%s\\0\"\n",ctx->dasm_ident);
    }
    goto LAB_0010b833;
  }
  fprintf((FILE *)ctx->fp,"\t.ident \"%s\"\n",ctx->dasm_ident);
LAB_0010b833:
  fprintf((FILE *)ctx->fp,"\n");
  return;
}

Assistant:

void emit_asm(BuildCtx *ctx)
{
  int i, rel;

  fprintf(ctx->fp, "\t.file \"buildvm_%s.dasc\"\n", ctx->dasm_arch);
  fprintf(ctx->fp, "\t.text\n");
#if LJ_TARGET_MIPS32 && !LJ_ABI_SOFTFP
  fprintf(ctx->fp, "\t.module fp=32\n");
#endif
#if LJ_TARGET_MIPS
  fprintf(ctx->fp, "\t.set nomips16\n\t.abicalls\n\t.set noreorder\n\t.set nomacro\n");
#endif
  emit_asm_align(ctx, 4);

#if LJ_TARGET_PS3
  emit_asm_label(ctx, ctx->beginsym, ctx->codesz, 0);
#else
  emit_asm_label(ctx, ctx->beginsym, 0, 0);
#endif
  if (ctx->mode != BUILD_machasm)
    fprintf(ctx->fp, ".Lbegin:\n");

#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND
  /* This should really be moved into buildvm_arm.dasc. */
#if LJ_ARCH_HASFPU
  fprintf(ctx->fp,
	  ".fnstart\n"
	  ".save {r5, r6, r7, r8, r9, r10, r11, lr}\n"
	  ".vsave {d8-d15}\n"
	  ".save {r4}\n"
	  ".pad #28\n");
#else
  fprintf(ctx->fp,
	  ".fnstart\n"
	  ".save {r4, r5, r6, r7, r8, r9, r10, r11, lr}\n"
	  ".pad #28\n");
#endif
#endif

  for (i = rel = 0; i < ctx->nsym; i++) {
    int32_t ofs = ctx->sym[i].ofs;
    int32_t next = ctx->sym[i+1].ofs;
#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND && LJ_HASFFI
    if (!strcmp(ctx->sym[i].name, "lj_vm_ffi_call"))
      fprintf(ctx->fp,
	      ".globl lj_err_unwind_arm\n"
	      ".personality lj_err_unwind_arm\n"
	      ".fnend\n"
	      ".fnstart\n"
	      ".save {r4, r5, r11, lr}\n"
	      ".setfp r11, sp\n");
#endif
    emit_asm_label(ctx, ctx->sym[i].name, next - ofs, 1);
    while (rel < ctx->nreloc && ctx->reloc[rel].ofs <= next) {
      BuildReloc *r = &ctx->reloc[rel];
      int n = r->ofs - ofs;
#if LJ_TARGET_X86ORX64
      if (r->type != 0 &&
	  (ctx->mode == BUILD_elfasm || ctx->mode == BUILD_machasm)) {
	emit_asm_reloc_text(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      } else {
	emit_asm_bytes(ctx, ctx->code+ofs, n);
	emit_asm_reloc(ctx, r->type, ctx->relocsym[r->sym]);
      }
      ofs += n+4;
#else
      emit_asm_wordreloc(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      ofs += n;
#endif
      rel++;
    }
#if LJ_TARGET_X86ORX64
    emit_asm_bytes(ctx, ctx->code+ofs, next-ofs);
#else
    emit_asm_words(ctx, ctx->code+ofs, next-ofs);
#endif
  }

#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND
  fprintf(ctx->fp,
#if !LJ_HASFFI
	  ".globl lj_err_unwind_arm\n"
	  ".personality lj_err_unwind_arm\n"
#endif
	  ".fnend\n");
#endif

  fprintf(ctx->fp, "\n");
  switch (ctx->mode) {
  case BUILD_elfasm:
#if !(LJ_TARGET_PS3 || LJ_TARGET_PSVITA)
    fprintf(ctx->fp, "\t.section .note.GNU-stack,\"\"," ELFASM_PX "progbits\n");
#endif
#if LJ_TARGET_PPC && !LJ_TARGET_PS3 && !LJ_ABI_SOFTFP
    /* Hard-float ABI. */
    fprintf(ctx->fp, "\t.gnu_attribute 4, 1\n");
#endif
    /* fallthrough */
  case BUILD_coffasm:
    fprintf(ctx->fp, "\t.ident \"%s\"\n", ctx->dasm_ident);
    break;
  case BUILD_machasm:
    fprintf(ctx->fp,
      "\t.cstring\n"
      "\t.ascii \"%s\\0\"\n", ctx->dasm_ident);
    break;
  default:
    break;
  }
  fprintf(ctx->fp, "\n");
}